

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

UnknownFieldSet * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  UnknownFieldSet *pUVar1;
  ArenaImpl *this_00;
  
  this_00 = (ArenaImpl *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(ArenaImpl **)(((ulong)this_00 & 0xfffffffffffffffe) + 0x18);
  }
  if (this_00 == (ArenaImpl *)0x0) {
    pUVar1 = (UnknownFieldSet *)operator_new(0x20);
  }
  else {
    if (this_00[1].initial_block_ != (Block *)0x0) {
      Arena::OnArenaAllocation
                ((Arena *)this_00,
                 (type_info *)
                 &InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  ::Container::typeinfo,0x20);
    }
    pUVar1 = (UnknownFieldSet *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       (this_00,0x20,
                        arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                       );
  }
  (pUVar1->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar1[1].fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->ptr_ = (void *)((ulong)pUVar1 | 1);
  pUVar1[1].fields_.
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  return pUVar1;
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }